

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr * __thiscall c4::yml::Tree::val_tag(Tree *this,size_t node)

{
  Location loc;
  error_flags eVar1;
  NodeData *pNVar2;
  undefined8 in_RSI;
  size_t in_RDI;
  bool bVar3;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  Location *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffffb8;
  Tree *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 uVar4;
  size_t sVar5;
  
  uVar4 = in_RSI;
  sVar5 = in_RDI;
  pNVar2 = _p(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar3 = false;
  if (((pNVar2->m_type).type & VALTAG) != NOTYPE) {
    bVar3 = ((pNVar2->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
  }
  if (!bVar3) {
    eVar1 = get_error_flags();
    if (((eVar1 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                       ,in_stack_ffffffffffffff68);
    loc.super_LineCol.line = in_RSI;
    loc.super_LineCol.offset = in_stack_ffffffffffffffd0;
    loc.super_LineCol.col = in_RDI;
    loc.name.str = (char *)uVar4;
    loc.name.len = sVar5;
    error<32ul>((char (*) [32])in_stack_ffffffffffffffc0,loc);
  }
  pNVar2 = _p(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return &(pNVar2->m_val).tag;
}

Assistant:

csubstr    const& val_tag   (size_t node) const { RYML_ASSERT(has_val_tag(node)); return _p(node)->m_val.tag; }